

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O3

bool aeron::util::MemoryMappedFile::fill(FileHandle fd,size_t size,uint8_t value)

{
  void *__s;
  ulong __n;
  size_t sVar1;
  undefined7 in_register_00000011;
  bool bVar2;
  
  __n = m_page_size;
  __s = operator_new__(m_page_size);
  memset(__s,(int)CONCAT71(in_register_00000011,value),__n);
  if (__n <= size) {
    do {
      __n = write(fd.handle,__s,__n);
      if (__n != m_page_size) goto LAB_0014a722;
      size = size - __n;
    } while (__n <= size);
  }
  if (size != 0) {
    sVar1 = write(fd.handle,__s,size);
    if (sVar1 != size) {
LAB_0014a722:
      bVar2 = false;
      goto LAB_0014a724;
    }
  }
  bVar2 = true;
LAB_0014a724:
  operator_delete__(__s);
  return bVar2;
}

Assistant:

bool MemoryMappedFile::fill(FileHandle fd, size_t size, uint8_t value)
{
    std::unique_ptr<uint8_t[]> buffer(new uint8_t[m_page_size]);
    memset(buffer.get(), value, m_page_size);

    while (size >= m_page_size)
    {
        if (static_cast<size_t>(write(fd.handle, buffer.get(), m_page_size)) != m_page_size)
        {
            return false;
        }

        size -= m_page_size;
    }

    if (size)
    {
        if (static_cast<size_t>(write(fd.handle, buffer.get(), size)) != size)
        {
            return false;
        }
    }
    return true;
}